

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestInfo * __thiscall testing::UnitTest::current_test_info(UnitTest *this)

{
  long lVar1;
  TestInfo *pTVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  pTVar2 = this->impl_->current_test_info_;
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pTVar2;
  }
  __stack_chk_fail();
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_info();
}